

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O1

unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall Client::read_until<std::__cxx11::stringstream>(Client *this,string *pattern)

{
  void *__buf;
  int iVar1;
  stringstream *this_00;
  ssize_t sVar2;
  long lVar3;
  ulong *in_RDX;
  int iVar4;
  long *in_FS_OFFSET;
  long *local_68;
  long local_60;
  long local_58 [2];
  stringstream *local_48;
  stringstream *local_40;
  string *local_38;
  
  local_38 = pattern;
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  __buf = (void *)(*in_FS_OFFSET + -0x19400);
  local_40 = this_00 + 0x10;
  local_48 = this_00 + 0x18;
  do {
    sVar2 = read(*(int *)&(local_38->_M_dataplus)._M_p,__buf,0x400);
    iVar4 = (int)sVar2;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,__buf,(long)iVar4 + (long)__buf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_40,(char *)local_68,local_60);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    lVar3 = std::__cxx11::string::find((char *)&local_68,*in_RDX,0);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    iVar1 = 3;
    if ((iVar4 != 0 && lVar3 == -1) && (iVar1 = 0, iVar4 == -1)) {
      *(undefined8 *)this = 0;
      iVar1 = 1;
    }
  } while (iVar1 == 0);
  if (iVar1 == 3) {
    *(stringstream **)this = this_00;
    this_00 = (stringstream *)0x0;
  }
  if (this_00 != (stringstream *)0x0) {
    (**(code **)(*(long *)this_00 + 8))();
  }
  return (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> Client::read_until(const std::string& pattern) {
    std::unique_ptr<T> ss(std::make_unique<T>());

    while (true) {
        int read_count = read(socket , buffer, READ_BUFFER_SIZE); 
        *ss << std::string(buffer, read_count);
        if (ss->str().find(pattern) != std::string::npos || read_count == 0) {
            break;
        }
        if (read_count == EOF) {
            return nullptr;
        }
    }

    return ss;
}